

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

void __thiscall APowerMask::DoEffect(APowerMask *this)

{
  AActor *ent;
  FSoundID local_14;
  
  APowerIronFeet::DoEffect(&this->super_APowerIronFeet);
  if (((byte)level.time & 0x3f) == 0) {
    ent = (this->super_APowerIronFeet).super_APowerup.super_AInventory.Owner.field_0.p;
    if ((ent != (AActor *)0x0) &&
       ((*(byte *)((long)&(ent->super_DThinker).super_DObject + 0x20) & 0x20) != 0)) {
      (this->super_APowerIronFeet).super_APowerup.super_AInventory.Owner.field_0.p = (AActor *)0x0;
      ent = (AActor *)0x0;
    }
    S_FindSound("misc/mask");
    S_Sound(ent,0,&local_14,1.0,3.0);
  }
  return;
}

Assistant:

void APowerMask::DoEffect ()
{
	Super::DoEffect ();
	if (!(level.time & 0x3f))
	{
		S_Sound (Owner, CHAN_AUTO, "misc/mask", 1, ATTN_STATIC);
	}
}